

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

bool __thiscall
cmMakefile::HaveCStandardAvailable(cmMakefile *this,cmTarget *target,string *feature)

{
  char *test;
  char **ppcVar1;
  char *pcVar2;
  char **ppcVar3;
  ostream *poVar4;
  bool needC11;
  bool needC99;
  bool needC90;
  string local_288;
  cmStrCmp local_268;
  cmStrCmp local_248;
  cmStrCmp local_228;
  cmStrCmp local_208;
  cmStrCmp local_1e8;
  cmStrCmp local_1c8;
  ostringstream e;
  
  std::__cxx11::string::string((string *)&e,"CMAKE_C_STANDARD_DEFAULT",(allocator *)&local_288);
  test = GetDefinition(this,(string *)&e);
  std::__cxx11::string::~string((string *)&e);
  if (test == (char *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    std::operator<<((ostream *)&e,
                    "CMAKE_C_STANDARD_DEFAULT is not set.  COMPILE_FEATURES support not fully configured for this compiler."
                   );
    std::__cxx11::stringbuf::str();
    IssueMessage(this,INTERNAL_ERROR,&local_288);
    std::__cxx11::string::~string((string *)&local_288);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
    return true;
  }
  cmStrCmp::cmStrCmp(&local_1c8,test);
  ppcVar1 = std::find_if<char_const*const*,cmStrCmp>(C_STANDARDS,(char **)&DAT_006a8a88,&local_1c8);
  std::__cxx11::string::~string((string *)&local_1c8);
  if (ppcVar1 == (char **)&DAT_006a8a88) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    poVar4 = std::operator<<((ostream *)&e,
                             "The CMAKE_C_STANDARD_DEFAULT variable contains an invalid value: \"");
    poVar4 = std::operator<<(poVar4,test);
    std::operator<<(poVar4,"\".");
    std::__cxx11::stringbuf::str();
    IssueMessage(this,INTERNAL_ERROR,&local_288);
  }
  else {
    needC90 = false;
    needC99 = false;
    needC11 = false;
    CheckNeededCLanguage(this,feature,&needC90,&needC99,&needC11);
    std::__cxx11::string::string((string *)&e,"C_STANDARD",(allocator *)&local_288);
    pcVar2 = cmTarget::GetProperty(target,(string *)&e);
    std::__cxx11::string::~string((string *)&e);
    if (pcVar2 != (char *)0x0) {
      test = pcVar2;
    }
    cmStrCmp::cmStrCmp(&local_1e8,test);
    ppcVar1 = std::find_if<char_const*const*,cmStrCmp>
                        (C_STANDARDS,(char **)&DAT_006a8a88,&local_1e8);
    std::__cxx11::string::~string((string *)&local_1e8);
    if (ppcVar1 != (char **)&DAT_006a8a88) {
      cmStrCmp::cmStrCmp(&local_208,test);
      ppcVar1 = std::find_if<char_const*const*,cmStrCmp>
                          (C_STANDARDS,(char **)&DAT_006a8a88,&local_208);
      std::__cxx11::string::~string((string *)&local_208);
      if (needC11 == true) {
        cmStrCmp::cmStrCmp(&local_228,"11");
        ppcVar3 = std::find_if<char_const*const*,cmStrCmp>
                            (C_STANDARDS,(char **)&DAT_006a8a88,&local_228);
        std::__cxx11::string::~string((string *)&local_228);
        if (ppcVar1 < ppcVar3) {
          return false;
        }
      }
      if (needC99 == true) {
        cmStrCmp::cmStrCmp(&local_248,"99");
        ppcVar3 = std::find_if<char_const*const*,cmStrCmp>
                            (C_STANDARDS,(char **)&DAT_006a8a88,&local_248);
        std::__cxx11::string::~string((string *)&local_248);
        if (ppcVar1 < ppcVar3) {
          return false;
        }
      }
      if (needC90 == true) {
        cmStrCmp::cmStrCmp(&local_268,"90");
        ppcVar3 = std::find_if<char_const*const*,cmStrCmp>
                            (C_STANDARDS,(char **)&DAT_006a8a88,&local_268);
        std::__cxx11::string::~string((string *)&local_268);
        return ppcVar3 <= ppcVar1;
      }
      return true;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    poVar4 = std::operator<<((ostream *)&e,"The C_STANDARD property on target \"");
    poVar4 = std::operator<<(poVar4,(string *)&target->Name);
    poVar4 = std::operator<<(poVar4,"\" contained an invalid value: \"");
    poVar4 = std::operator<<(poVar4,test);
    std::operator<<(poVar4,"\".");
    std::__cxx11::stringbuf::str();
    IssueMessage(this,FATAL_ERROR,&local_288);
  }
  std::__cxx11::string::~string((string *)&local_288);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
  return false;
}

Assistant:

bool cmMakefile::HaveCStandardAvailable(cmTarget const* target,
                                        const std::string& feature) const
{
  const char* defaultCStandard =
    this->GetDefinition("CMAKE_C_STANDARD_DEFAULT");
  if (!defaultCStandard) {
    std::ostringstream e;
    e << "CMAKE_C_STANDARD_DEFAULT is not set.  COMPILE_FEATURES support "
         "not fully configured for this compiler.";
    this->IssueMessage(cmake::INTERNAL_ERROR, e.str());
    // Return true so the caller does not try to lookup the default standard.
    return true;
  }
  if (std::find_if(cmArrayBegin(C_STANDARDS), cmArrayEnd(C_STANDARDS),
                   cmStrCmp(defaultCStandard)) == cmArrayEnd(C_STANDARDS)) {
    std::ostringstream e;
    e << "The CMAKE_C_STANDARD_DEFAULT variable contains an "
         "invalid value: \""
      << defaultCStandard << "\".";
    this->IssueMessage(cmake::INTERNAL_ERROR, e.str());
    return false;
  }

  bool needC90 = false;
  bool needC99 = false;
  bool needC11 = false;

  this->CheckNeededCLanguage(feature, needC90, needC99, needC11);

  const char* existingCStandard = target->GetProperty("C_STANDARD");
  if (!existingCStandard) {
    existingCStandard = defaultCStandard;
  }

  if (std::find_if(cmArrayBegin(C_STANDARDS), cmArrayEnd(C_STANDARDS),
                   cmStrCmp(existingCStandard)) == cmArrayEnd(C_STANDARDS)) {
    std::ostringstream e;
    e << "The C_STANDARD property on target \"" << target->GetName()
      << "\" contained an invalid value: \"" << existingCStandard << "\".";
    this->IssueMessage(cmake::FATAL_ERROR, e.str());
    return false;
  }

  const char* const* existingCIt = existingCStandard
    ? std::find_if(cmArrayBegin(C_STANDARDS), cmArrayEnd(C_STANDARDS),
                   cmStrCmp(existingCStandard))
    : cmArrayEnd(C_STANDARDS);

  if (needC11 && existingCStandard &&
      existingCIt < std::find_if(cmArrayBegin(C_STANDARDS),
                                 cmArrayEnd(C_STANDARDS), cmStrCmp("11"))) {
    return false;
  }
  if (needC99 && existingCStandard &&
      existingCIt < std::find_if(cmArrayBegin(C_STANDARDS),
                                 cmArrayEnd(C_STANDARDS), cmStrCmp("99"))) {
    return false;
  }
  if (needC90 && existingCStandard &&
      existingCIt < std::find_if(cmArrayBegin(C_STANDARDS),
                                 cmArrayEnd(C_STANDARDS), cmStrCmp("90"))) {
    return false;
  }
  return true;
}